

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::convertTextData<char>
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,char *source,char *pointerToStore,
          int sizeWithoutHeader)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  unsigned_long *puVar3;
  int i;
  char cc;
  size_t numShift;
  int sizeWithoutHeader_local;
  char *pointerToStore_local;
  char *source_local;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)sizeWithoutHeader;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  puVar3 = (unsigned_long *)operator_new__(uVar2);
  this->TextData = puVar3;
  __assert_fail("numShift < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/irrXML/CXMLReaderImpl.h"
                ,0x2a9,
                "void irr::io::CXMLReaderImpl<unsigned long, irr::io::IXMLBase>::convertTextData(src_char_type *, char *, int) [char_type = unsigned long, superclass = irr::io::IXMLBase, src_char_type = char]"
               );
}

Assistant:

void convertTextData(src_char_type* source, char* pointerToStore, int sizeWithoutHeader)
	{
		// convert little to big endian if necessary
		if (sizeof(src_char_type) > 1 && 
			isLittleEndian(TargetFormat) != isLittleEndian(SourceFormat))
			convertToLittleEndian(source);

		// check if conversion is necessary:
		if (sizeof(src_char_type) == sizeof(char_type))
		{
			// no need to convert
			TextBegin = (char_type*)source;
			TextData = (char_type*)pointerToStore;
			TextSize = sizeWithoutHeader;
		}
		else
		{
			// convert source into target data format. 
			// TODO: implement a real conversion. This one just 
			// copies bytes. This is a problem when there are 
			// unicode symbols using more than one character.

			TextData = new char_type[sizeWithoutHeader];

			// MSVC debugger complains here about loss of data ...
			size_t numShift = sizeof( char_type) * 8;
			assert(numShift < 64);
			const src_char_type cc = (src_char_type)(((uint64_t(1u) << numShift) - 1));
			for (int i=0; i<sizeWithoutHeader; ++i)
				TextData[i] = char_type( source[i] & cc); 

			TextBegin = TextData;
			TextSize = sizeWithoutHeader;

			// delete original data because no longer needed
			delete [] pointerToStore;
		}
	}